

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O1

void __thiscall binlog::EventStream::readWriterProp(EventStream *this,Range range)

{
  WriterProp wp;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  uint64_t local_30;
  Range local_28;
  
  local_28._end = range._end;
  local_28._begin = range._begin;
  local_58 = (undefined1  [8])0x0;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30 = 0;
  local_50._M_p = (pointer)&local_40;
  mserialize::
  StructDeserializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
  ::deserialize<binlog::Range>((WriterProp *)local_58,&local_28);
  (this->_writerProp).id = (uint64_t)local_58;
  std::__cxx11::string::operator=((string *)&(this->_writerProp).name,(string *)&local_50);
  (this->_writerProp).batchSize = local_30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EventStream::readWriterProp(Range range)
{
  // Make sure _writerProp is updated only if deserialize does not throw
  WriterProp wp;
  mserialize::deserialize(wp, range);
  _writerProp = std::move(wp);
}